

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueueWriter.hpp
# Opt level: O0

size_t __thiscall binlog::detail::QueueWriter::maximizeWriteCapacity(QueueWriter *this)

{
  Queue *pQVar1;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  long lVar5;
  size_t sVar6;
  QueueWriter *in_RDI;
  int64_t leftSize;
  int64_t rightSize;
  size_t r;
  size_t w;
  memory_order __b_1;
  memory_order __b;
  
  pQVar1 = in_RDI->_queue;
  std::operator&(memory_order_relaxed,__memory_order_mask);
  uVar2 = (pQVar1->writeIndex).super___atomic_base<unsigned_long>._M_i;
  pQVar1 = in_RDI->_queue;
  std::operator&(memory_order_acquire,__memory_order_mask);
  uVar3 = (pQVar1->readIndex).super___atomic_base<unsigned_long>._M_i;
  if (uVar2 < uVar3) {
    pcVar4 = buffer(in_RDI);
    in_RDI->_writePos = pcVar4 + uVar2;
    pcVar4 = buffer(in_RDI);
    in_RDI->_writeEnd = pcVar4 + (uVar3 - 1);
  }
  else {
    lVar5 = in_RDI->_queue->capacity - uVar2;
    if (lVar5 < (long)(uVar3 - 1)) {
      in_RDI->_queue->dataEnd = uVar2;
      pcVar4 = buffer(in_RDI);
      in_RDI->_writePos = pcVar4;
      pcVar4 = buffer(in_RDI);
      in_RDI->_writeEnd = pcVar4 + (uVar3 - 1);
    }
    else {
      pcVar4 = buffer(in_RDI);
      in_RDI->_writePos = pcVar4 + uVar2;
      pcVar4 = buffer(in_RDI);
      in_RDI->_writeEnd = pcVar4 + lVar5 + uVar2;
    }
  }
  sVar6 = writeCapacity(in_RDI);
  return sVar6;
}

Assistant:

std::size_t maximizeWriteCapacity()
  {
    const std::size_t w = _queue->writeIndex.load(std::memory_order_relaxed);
    const std::size_t r = _queue->readIndex.load(std::memory_order_acquire);

    if (w < r) // [####W.....R###E..]
    {
      _writePos = buffer() + w;
      _writeEnd = buffer() + r - 1;
    }
    else // [...R###W......]
    {
      const std::int64_t rightSize = std::int64_t(_queue->capacity - w);
      const std::int64_t leftSize = std::int64_t(r) - 1;

      if (rightSize >= leftSize)
      {
        _writePos = buffer() + w;
        _writeEnd = buffer() + w + rightSize;
      }
      else
      {
        _queue->dataEnd = w;
        _writePos = buffer();
        _writeEnd = buffer() + leftSize;
      }
    }

    return writeCapacity();
  }